

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotation_test_util.cc
# Opt level: O0

void google::protobuf::compiler::annotation_test_util::FindAnnotationsOnPath
               (GeneratedCodeInfo *info,string *source_file,vector<int,_std::allocator<int>_> *path,
               vector<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
               *annotations)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int32_t iVar4;
  string *__lhs;
  size_type sVar5;
  const_reference pvVar6;
  int local_3c;
  GeneratedCodeInfo_Annotation *pGStack_38;
  int node;
  Annotation *annotation;
  vector<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
  *pvStack_28;
  int i;
  vector<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
  *annotations_local;
  vector<int,_std::allocator<int>_> *path_local;
  string *source_file_local;
  GeneratedCodeInfo *info_local;
  
  annotation._4_4_ = 0;
  pvStack_28 = annotations;
  annotations_local =
       (vector<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
        *)path;
  path_local = (vector<int,_std::allocator<int>_> *)source_file;
  source_file_local = (string *)info;
  do {
    iVar3 = annotation._4_4_;
    iVar2 = GeneratedCodeInfo::annotation_size((GeneratedCodeInfo *)source_file_local);
    if (iVar2 <= iVar3) {
      return;
    }
    pGStack_38 = GeneratedCodeInfo::annotation
                           ((GeneratedCodeInfo *)source_file_local,annotation._4_4_);
    __lhs = GeneratedCodeInfo_Annotation::source_file_abi_cxx11_(pGStack_38);
    bVar1 = std::operator!=(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)path_local);
    if (!bVar1) {
      iVar3 = GeneratedCodeInfo_Annotation::path_size(pGStack_38);
      sVar5 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)annotations_local);
      if ((long)iVar3 == sVar5) {
        for (local_3c = 0;
            sVar5 = std::vector<int,_std::allocator<int>_>::size
                              ((vector<int,_std::allocator<int>_> *)annotations_local),
            (ulong)(long)local_3c < sVar5; local_3c = local_3c + 1) {
          iVar4 = GeneratedCodeInfo_Annotation::path(pGStack_38,local_3c);
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)annotations_local,(long)local_3c)
          ;
          if (iVar4 != *pvVar6) break;
        }
        sVar5 = std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)annotations_local);
        if ((long)local_3c == sVar5) {
          std::
          vector<const_google::protobuf::GeneratedCodeInfo_Annotation_*,_std::allocator<const_google::protobuf::GeneratedCodeInfo_Annotation_*>_>
          ::push_back(pvStack_28,&stack0xffffffffffffffc8);
        }
      }
    }
    annotation._4_4_ = annotation._4_4_ + 1;
  } while( true );
}

Assistant:

void FindAnnotationsOnPath(
    const GeneratedCodeInfo& info, const std::string& source_file,
    const std::vector<int>& path,
    std::vector<const GeneratedCodeInfo::Annotation*>* annotations) {
  for (int i = 0; i < info.annotation_size(); ++i) {
    const GeneratedCodeInfo::Annotation* annotation = &info.annotation(i);
    if (annotation->source_file() != source_file ||
        annotation->path_size() != path.size()) {
      continue;
    }
    int node = 0;
    for (; node < path.size(); ++node) {
      if (annotation->path(node) != path[node]) {
        break;
      }
    }
    if (node == path.size()) {
      annotations->push_back(annotation);
    }
  }
}